

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O2

void __thiscall Image_CopyRectIn_Test::~Image_CopyRectIn_Test(Image_CopyRectIn_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Image, CopyRectIn) {
    Point2i res(17, 32);
    RNG rng;

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        for (int nc = 1; nc < 4; ++nc) {
            pstd::vector<float> orig = GetFloatPixels(res, nc);

            std::vector<std::string> channelNames = {"A"};
            for (int i = 1; i < nc; ++i)
                channelNames.push_back(std::string(1, 'A' + 1));

            Image image(format, res, channelNames, ColorEncodingHandle::Linear);
            auto origIter = orig.begin();
            for (int y = 0; y < res[1]; ++y)
                for (int x = 0; x < res[0]; ++x)
                    for (int c = 0; c < nc; ++c, ++origIter)
                        image.SetChannel({x, y}, c, *origIter);

            Bounds2i extent(Point2i(10, 23), Point2i(17, 28));
            std::vector<float> buf(extent.Area() * nc);
            std::generate(buf.begin(), buf.end(),
                          [&rng]() { return rng.Uniform<Float>(); });

            image.CopyRectIn(extent, buf);

            // Iterate through the points in the extent and the buffer
            // together.
            auto bufIter = buf.begin();
            for (auto pIter = begin(extent); pIter != end(extent); ++pIter) {
                for (int c = 0; c < nc; ++c) {
                    ASSERT_FALSE(bufIter == buf.end());
                    if (format == PixelFormat::U256) {
                        Float err =
                            std::abs(image.GetChannel(*pIter, c) - Clamp(*bufIter, 0, 1));
                        EXPECT_LT(err, 0.501f / 255.f);
                    } else {
                        Float qv = modelQuantization(*bufIter, format);
                        EXPECT_EQ(qv, image.GetChannel(*pIter, c));
                    }
                    ++bufIter;
                }
            }
        }
    }
}